

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

void sexp_insert_timed(sexp_conflict ctx,sexp_conflict thread,sexp_conflict timeout)

{
  int iVar1;
  sexp psVar2;
  sexp_conflict psVar3;
  long lVar4;
  sexp_tag_t sVar5;
  long lVar6;
  undefined8 uVar7;
  sexp_conflict *ppsVar8;
  long lVar9;
  sexp_conflict psVar10;
  sexp_conflict psVar11;
  sexp_conflict **pppsVar12;
  sexp_conflict psVar13;
  double __x;
  double dVar14;
  
  psVar2 = (ctx->value).type.setters;
  psVar13 = (sexp_conflict)(psVar2->value).context.mark_stack[10].end;
  if (((ulong)psVar13 & 3) == 0) {
    psVar10 = (sexp_conflict)(sexp_conflict *)0x0;
    psVar11 = psVar13;
    do {
      if (psVar11->tag != 6) break;
      if (*(sexp_conflict *)&psVar11->value == thread) {
        pppsVar12 = (sexp_conflict **)((long)psVar10 + 0x10);
        if (psVar10 == (sexp_conflict)0x0) {
          pppsVar12 = &(psVar2->value).context.mark_stack[10].end;
        }
        *pppsVar12 = (sexp_conflict *)*(sexp_conflict *)((long)&psVar11->value + 8);
        psVar13 = (sexp_conflict)(((ctx->value).type.setters)->value).context.mark_stack[10].end;
        break;
      }
      psVar3 = *(sexp_conflict *)((long)&psVar11->value + 8);
      psVar10 = psVar11;
      psVar11 = psVar3;
    } while (((ulong)psVar3 & 3) == 0);
  }
  if (((ulong)timeout & 1) == 0) {
    if (((ulong)timeout & 2) == 0) {
      sVar5 = timeout->tag;
      if (sVar5 - 0xb < 3) {
        gettimeofday((timeval *)&(thread->value).context.tval,(__timezone_ptr_t)0x0);
        sVar5 = timeout->tag;
      }
      if (sVar5 == 0xb) {
        __x = (timeout->value).flonum;
LAB_001027ce:
        dVar14 = trunc(__x);
        lVar6 = (long)((double)(thread->value).context.tval.tv_sec + dVar14);
        (thread->value).context.tval.tv_sec = lVar6;
        lVar9 = (long)((__x - dVar14) * 1000000.0 + (double)(thread->value).context.tval.tv_usec);
        (thread->value).context.tval.tv_usec = lVar9;
        if (1000000 < lVar9) {
          lVar6 = lVar6 + 1;
          (thread->value).context.tval.tv_sec = lVar6;
          lVar9 = lVar9 + -1000000;
LAB_00102838:
          (thread->value).context.tval.tv_usec = lVar9;
        }
      }
      else {
        if (sVar5 == 0xd) {
          __x = (double)sexp_ratio_to_double(ctx,timeout);
          goto LAB_001027ce;
        }
        if (sVar5 == 0x24) {
          lVar6 = (timeout->value).context.tval.tv_sec;
          (thread->value).context.tval.tv_sec = lVar6;
          lVar9 = (timeout->value).context.tval.tv_usec;
          goto LAB_00102838;
        }
        (thread->value).context.tval.tv_sec = 0;
        (thread->value).context.tval.tv_usec = 0;
        lVar6 = 0;
      }
      if (((ulong)timeout->tag < 0x25) && ((0x1000003800U >> ((ulong)timeout->tag & 0x3f) & 1) != 0)
         ) goto LAB_00102872;
    }
    else {
      (thread->value).context.tval.tv_sec = 0;
      (thread->value).context.tval.tv_usec = 0;
    }
    if (((ulong)psVar13 & 3) != 0) goto LAB_00102908;
    iVar1 = psVar13->tag;
    psVar10 = (sexp_conflict)&DAT_0000023e;
    psVar11 = psVar13;
    while (((psVar13 = psVar11, iVar1 == 6 &&
            (*(long *)((long)(psVar11->value).type.name + 0x6098) != 0)) &&
           (psVar13 = *(sexp_conflict *)((long)&psVar11->value + 8), psVar10 = psVar11,
           ((ulong)psVar13 & 3) == 0))) {
      iVar1 = psVar13->tag;
      psVar11 = psVar13;
    }
  }
  else {
    gettimeofday((timeval *)&(thread->value).context.tval,(__timezone_ptr_t)0x0);
    lVar6 = ((long)timeout >> 1) + (thread->value).context.tval.tv_sec;
    (thread->value).context.tval.tv_sec = lVar6;
LAB_00102872:
    if (((ulong)psVar13 & 3) != 0) goto LAB_00102908;
    iVar1 = psVar13->tag;
    psVar10 = (sexp_conflict)&DAT_0000023e;
    psVar11 = psVar13;
    while (psVar13 = psVar11, iVar1 == 6) {
      lVar9 = (long)(psVar11->value).type.name;
      lVar4 = *(long *)(lVar9 + 0x6098);
      if ((((lVar4 == 0) && (*(long *)(lVar9 + 0x60a0) == 0)) ||
          ((lVar6 <= lVar4 &&
           ((lVar4 != lVar6 || ((thread->value).context.tval.tv_usec <= *(long *)(lVar9 + 0x60a0))))
           ))) || (psVar13 = *(sexp_conflict *)((long)&psVar11->value + 8), psVar10 = psVar11,
                  ((ulong)psVar13 & 3) != 0)) break;
      psVar11 = psVar13;
      iVar1 = psVar13->tag;
    }
  }
  if (psVar10 != (sexp_conflict)&DAT_0000023e) {
    uVar7 = sexp_cons_op(ctx,0,2,thread,psVar13);
    *(undefined8 *)((long)&psVar10->value + 8) = uVar7;
    return;
  }
LAB_00102908:
  ppsVar8 = (sexp_conflict *)sexp_cons_op(ctx,0,2,thread,psVar13);
  (((ctx->value).type.setters)->value).context.mark_stack[10].end = ppsVar8;
  return;
}

Assistant:

static void sexp_insert_timed (sexp ctx, sexp thread, sexp timeout) {
#if SEXP_USE_FLONUMS
  double d;
#endif
  sexp ls1=SEXP_NULL, ls2;
  sexp_delete_list(ctx, SEXP_G_THREADS_PAUSED, thread);
  ls2 = sexp_global(ctx, SEXP_G_THREADS_PAUSED);
  if (sexp_realp(timeout))
    gettimeofday(&sexp_context_timeval(thread), NULL);
  if (sexp_fixnump(timeout)) {
    sexp_context_timeval(thread).tv_sec += sexp_unbox_fixnum(timeout);
#if SEXP_USE_FLONUMS
  } else if (sexp_flonump(timeout)) {
    d = sexp_flonum_value(timeout);
    sexp_context_timeval(thread).tv_sec += trunc(d);
    sexp_context_timeval(thread).tv_usec += (d-trunc(d))*1000000;
    if (sexp_context_timeval(thread).tv_usec > 1000000) {
      sexp_context_timeval(thread).tv_sec += 1;
      sexp_context_timeval(thread).tv_usec -= 1000000;
    }
#endif
#if SEXP_USE_RATIOS
  } else if (sexp_ratiop(timeout)) {
    d = sexp_ratio_to_double(ctx, timeout);
    sexp_context_timeval(thread).tv_sec += trunc(d);
    sexp_context_timeval(thread).tv_usec += (d-trunc(d))*1000000;
    if (sexp_context_timeval(thread).tv_usec > 1000000) {
      sexp_context_timeval(thread).tv_sec += 1;
      sexp_context_timeval(thread).tv_usec -= 1000000;
    }
#endif
  } else if (sexp_contextp(timeout)) {
    sexp_context_timeval(thread).tv_sec = sexp_context_timeval(timeout).tv_sec;
    sexp_context_timeval(thread).tv_usec = sexp_context_timeval(timeout).tv_usec;
  } else {
    sexp_context_timeval(thread).tv_sec = 0;
    sexp_context_timeval(thread).tv_usec = 0;
  }
  if (sexp_realp(timeout) || sexp_contextp(timeout))
    while (sexp_pairp(ls2)
           && sexp_context_before(sexp_car(ls2), sexp_context_timeval(thread)))
      ls1=ls2, ls2=sexp_cdr(ls2);
  else
    while (sexp_pairp(ls2) && sexp_context_timeval(sexp_car(ls2)).tv_sec)
      ls1=ls2, ls2=sexp_cdr(ls2);
  if (ls1 == SEXP_NULL)
    sexp_global(ctx, SEXP_G_THREADS_PAUSED) = sexp_cons(ctx, thread, ls2);
  else
    sexp_cdr(ls1) = sexp_cons(ctx, thread, ls2);
}